

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rng.h
# Opt level: O0

void skipNextN(uint64_t *seed,uint64_t n)

{
  uint64_t k;
  uint64_t ia;
  uint64_t im;
  uint64_t a;
  uint64_t m;
  uint64_t n_local;
  uint64_t *seed_local;
  
  m = 1;
  a = 0;
  im = 0x5deece66d;
  ia = 0xb;
  for (k = n; k != 0; k = k >> 1) {
    if ((k & 1) != 0) {
      m = im * m;
      a = im * a + ia;
    }
    ia = (im + 1) * ia;
    im = im * im;
  }
  *seed = *seed * m + a;
  *seed = *seed & 0xffffffffffff;
  return;
}

Assistant:

static inline void skipNextN(uint64_t *seed, uint64_t n)
{
    uint64_t m = 1;
    uint64_t a = 0;
    uint64_t im = 0x5deece66dULL;
    uint64_t ia = 0xb;
    uint64_t k;

    for (k = n; k; k >>= 1)
    {
        if (k & 1)
        {
            m *= im;
            a = im * a + ia;
        }
        ia = (im + 1) * ia;
        im *= im;
    }

    *seed = *seed * m + a;
    *seed &= 0xffffffffffffULL;
}